

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3TokenizerFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Fts3Hash *pH;
  void *data;
  int iVar1;
  int iVar2;
  void *in_RAX;
  uchar *pKey;
  undefined8 *puVar3;
  void *pvVar4;
  char *pcVar5;
  void *local_38;
  
  pH = (Fts3Hash *)context->pFunc->pUserData;
  local_38 = in_RAX;
  pKey = sqlite3_value_text(*argv);
  iVar1 = sqlite3_value_bytes(*argv);
  if (argc != 2) {
    if (pKey != (uchar *)0x0) {
      local_38 = sqlite3Fts3HashFind(pH,pKey,iVar1 + 1);
      if (local_38 != (void *)0x0) goto LAB_001a17b3;
    }
    pcVar5 = sqlite3_mprintf("unknown tokenizer: %s",pKey);
    sqlite3_result_error(context,pcVar5,-1);
    sqlite3_free(pcVar5);
    return;
  }
  iVar2 = fts3TokenizerEnabled(context);
  if ((iVar2 == 0) && ((argv[1]->flags & 0x20) == 0)) {
    pcVar5 = "fts3tokenize disabled";
  }
  else {
    iVar2 = sqlite3_value_bytes(argv[1]);
    if ((pKey != (uchar *)0x0) && (iVar2 == 8)) {
      puVar3 = (undefined8 *)sqlite3_value_blob(argv[1]);
      data = (void *)*puVar3;
      local_38 = data;
      pvVar4 = sqlite3Fts3HashInsert(pH,pKey,iVar1 + 1,data);
      if (pvVar4 == data) {
        sqlite3_result_error(context,"out of memory",-1);
      }
LAB_001a17b3:
      iVar1 = fts3TokenizerEnabled(context);
      if ((iVar1 != 0) || (((*argv)->flags & 0x20) != 0)) {
        sqlite3_result_blob(context,&local_38,8,(_func_void_void_ptr *)0xffffffffffffffff);
      }
      return;
    }
    pcVar5 = "argument type mismatch";
  }
  sqlite3_result_error(context,pcVar5,-1);
  return;
}

Assistant:

static void fts3TokenizerFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  Fts3Hash *pHash;
  void *pPtr = 0;
  const unsigned char *zName;
  int nName;

  assert( argc==1 || argc==2 );

  pHash = (Fts3Hash *)sqlite3_user_data(context);

  zName = sqlite3_value_text(argv[0]);
  nName = sqlite3_value_bytes(argv[0])+1;

  if( argc==2 ){
    if( fts3TokenizerEnabled(context) || sqlite3_value_frombind(argv[1]) ){
      void *pOld;
      int n = sqlite3_value_bytes(argv[1]);
      if( zName==0 || n!=sizeof(pPtr) ){
        sqlite3_result_error(context, "argument type mismatch", -1);
        return;
      }
      pPtr = *(void **)sqlite3_value_blob(argv[1]);
      pOld = sqlite3Fts3HashInsert(pHash, (void *)zName, nName, pPtr);
      if( pOld==pPtr ){
        sqlite3_result_error(context, "out of memory", -1);
      }
    }else{
      sqlite3_result_error(context, "fts3tokenize disabled", -1);
      return;
    }
  }else{
    if( zName ){
      pPtr = sqlite3Fts3HashFind(pHash, zName, nName);
    }
    if( !pPtr ){
      char *zErr = sqlite3_mprintf("unknown tokenizer: %s", zName);
      sqlite3_result_error(context, zErr, -1);
      sqlite3_free(zErr);
      return;
    }
  }
  if( fts3TokenizerEnabled(context) || sqlite3_value_frombind(argv[0]) ){
    sqlite3_result_blob(context, (void *)&pPtr, sizeof(pPtr), SQLITE_TRANSIENT);
  }
}